

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::resize
          (mipmapped_texture *this,uint new_width,uint new_height,resample_params *params)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  component_flags new_flags;
  orientation_flags_t orient_flags;
  vector<crnlib::mip_level_*> *pvVar5;
  mip_level *pmVar6;
  mip_level **ppmVar7;
  image_u8 *this_00;
  mip_level *this_01;
  image<crnlib::color_quad<unsigned_char,_int>_> *p;
  uint local_c0;
  uint local_bc;
  uint l;
  uint f_2;
  resample_params rparams;
  image_u8 *pMip;
  image_u8 *pImg;
  image_u8 tmp;
  uint f_1;
  uint local_3c;
  undefined1 local_38 [4];
  uint f;
  face_vec faces;
  resample_params *params_local;
  uint new_height_local;
  uint new_width_local;
  mipmapped_texture *this_local;
  
  faces._8_8_ = params;
  bVar2 = is_valid(this);
  if (bVar2) {
    uVar3 = get_num_faces(this);
    vector<crnlib::vector<crnlib::mip_level_*>_>::vector
              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,uVar3);
    local_3c = 0;
    while( true ) {
      uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                        ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38);
      if (uVar3 <= local_3c) break;
      pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,local_3c);
      vector<crnlib::mip_level_*>::resize(pvVar5,1,false);
      pmVar6 = crnlib_new<crnlib::mip_level>();
      pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,local_3c);
      ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,0);
      *ppmVar7 = pmVar6;
      local_3c = local_3c + 1;
    }
    tmp.m_pixel_buf.m_size = 0;
    while( true ) {
      uVar3 = tmp.m_pixel_buf.m_size;
      uVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                        ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38);
      if (uVar4 <= uVar3) break;
      image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
      pmVar6 = get_level(this,tmp.m_pixel_buf.m_size,0);
      this_00 = mip_level::get_unpacked_image(pmVar6,(image_u8 *)&pImg,1);
      rparams._32_8_ =
           crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)pmVar6);
      image_utils::resample_params::resample_params((resample_params *)&l);
      rparams.m_pFilter._0_4_ = *(undefined4 *)(faces._8_8_ + 0xc);
      rparams.m_filter_scale = 0.0;
      l = new_width;
      f_2 = new_height;
      bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::is_component_valid(this_00,3);
      rparams._20_4_ = bVar2 + 3;
      rparams.m_pFilter._4_1_ = *(byte *)(faces._8_8_ + 9) & 1;
      rparams.m_pFilter._5_1_ = *(byte *)(faces._8_8_ + 8) & 1;
      rparams._0_8_ = *(undefined8 *)faces._8_8_;
      rparams.m_num_comps._0_1_ = *(byte *)(faces._8_8_ + 0x14) & 1;
      p = (image<crnlib::color_quad<unsigned_char,_int>_> *)rparams._32_8_;
      bVar2 = image_utils::resample(this_00,(image_u8 *)rparams._32_8_,(resample_params *)&l);
      if (bVar2) {
        if ((*(byte *)(faces._8_8_ + 10) & 1) != 0) {
          image_utils::renorm_normal_map((image_u8 *)rparams._32_8_);
        }
        uVar1 = rparams._32_8_;
        new_flags = image<crnlib::color_quad<unsigned_char,_int>_>::get_comp_flags(this_00);
        image<crnlib::color_quad<unsigned_char,_int>_>::set_comp_flags
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)uVar1,new_flags);
        pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                           ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,
                            tmp.m_pixel_buf.m_size);
        ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,0);
        uVar1 = rparams._32_8_;
        pmVar6 = *ppmVar7;
        this_01 = get_level(this,tmp.m_pixel_buf.m_size,0);
        orient_flags = mip_level::get_orientation_flags(this_01);
        mip_level::assign(pmVar6,(image_u8 *)uVar1,PIXEL_FMT_INVALID,orient_flags);
        bVar2 = false;
      }
      else {
        crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                  ((crnlib *)rparams._32_8_,p);
        local_bc = 0;
        while( true ) {
          uVar3 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                            ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38);
          if (uVar3 <= local_bc) break;
          local_c0 = 0;
          while( true ) {
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                               ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,local_bc);
            uVar3 = vector<crnlib::mip_level_*>::size(pvVar5);
            if (uVar3 <= local_c0) break;
            pvVar5 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                               ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38,local_bc);
            ppmVar7 = vector<crnlib::mip_level_*>::operator[](pvVar5,local_c0);
            crnlib_delete<crnlib::mip_level>(*ppmVar7);
            local_c0 = local_c0 + 1;
          }
          local_bc = local_bc + 1;
        }
        this_local._7_1_ = 0;
        bVar2 = true;
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&pImg);
      if (bVar2) goto LAB_0014fa0f;
      tmp.m_pixel_buf.m_size = tmp.m_pixel_buf.m_size + 1;
    }
    assign(this,(face_vec *)local_38);
    this_local._7_1_ = 1;
LAB_0014fa0f:
    vector<crnlib::vector<crnlib::mip_level_*>_>::~vector
              ((vector<crnlib::vector<crnlib::mip_level_*>_> *)local_38);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool mipmapped_texture::resize(uint new_width, uint new_height, const resample_params& params) {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  CRNLIB_ASSERT((new_width >= 1) && (new_height >= 1));

  face_vec faces(get_num_faces());
  for (uint f = 0; f < faces.size(); f++) {
    faces[f].resize(1);
    faces[f][0] = crnlib_new<mip_level>();
  }

  for (uint f = 0; f < faces.size(); f++) {
    image_u8 tmp;
    image_u8* pImg = get_level(f, 0)->get_unpacked_image(tmp, cUnpackFlagUncook);

    image_u8* pMip = crnlib_new<image_u8>();

    image_utils::resample_params rparams;
    rparams.m_dst_width = new_width;
    rparams.m_dst_height = new_height;
    rparams.m_filter_scale = params.m_filter_scale;
    rparams.m_first_comp = 0;
    rparams.m_num_comps = pImg->is_component_valid(3) ? 4 : 3;
    rparams.m_srgb = params.m_srgb;
    rparams.m_wrapping = params.m_wrapping;
    rparams.m_pFilter = params.m_pFilter;
    rparams.m_multithreaded = params.m_multithreaded;

    if (!image_utils::resample(*pImg, *pMip, rparams)) {
      crnlib_delete(pMip);

      for (uint f = 0; f < faces.size(); f++)
        for (uint l = 0; l < faces[f].size(); l++)
          crnlib_delete(faces[f][l]);

      return false;
    }

    if (params.m_renormalize)
      image_utils::renorm_normal_map(*pMip);

    pMip->set_comp_flags(pImg->get_comp_flags());

    faces[f][0]->assign(pMip, PIXEL_FMT_INVALID, get_level(f, 0)->get_orientation_flags());
  }

  assign(faces);

  CRNLIB_ASSERT(check());

  return true;
}